

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_0::isColorRenderable(deUint32 format)

{
  if ((int)format < 0x8c43) {
    if (((0x13 < format - 0x8229) || ((0xfff05U >> (format - 0x8229 & 0x1f) & 1) == 0)) &&
       ((10 < format - 0x804f || ((0x705U >> (format - 0x804f & 0x1f) & 1) == 0)))) {
      return false;
    }
  }
  else if ((((0x2c < format - 0x8d62) ||
            ((0x104104104001U >> ((ulong)(format - 0x8d62) & 0x3f) & 1) == 0)) && (format != 0x8c43)
           ) && (format != 0x906f)) {
    return false;
  }
  return true;
}

Assistant:

bool isColorRenderable (deUint32 format)
{
	switch (format)
	{
		case GL_R8:
		case GL_RG8:
		case GL_RGB8:
		case GL_RGB565:
		case GL_RGB4:
		case GL_RGB5_A1:
		case GL_RGBA8:
		case GL_RGB10_A2:
		case GL_RGB10_A2UI:
		case GL_SRGB8_ALPHA8:
		case GL_R8I:
		case GL_R8UI:
		case GL_R16I:
		case GL_R16UI:
		case GL_R32I:
		case GL_R32UI:
		case GL_RG8I:
		case GL_RG8UI:
		case GL_RG16I:
		case GL_RG16UI:
		case GL_RG32I:
		case GL_RG32UI:
		case GL_RGBA8I:
		case GL_RGBA8UI:
		case GL_RGBA16I:
		case GL_RGBA16UI:
		case GL_RGBA32I:
		case GL_RGBA32UI:
			return true;

		default:
			return false;
	}
}